

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_std.cc
# Opt level: O0

bool __thiscall benchmark::Regex::Init(Regex *this,string *spec,string *error)

{
  regex_error *e;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_40;
  string *local_20;
  string *error_local;
  string *spec_local;
  Regex *this_local;
  
  local_20 = error;
  error_local = spec;
  spec_local = (string *)this;
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_40,spec,0x40);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
            (&this->re_,&local_40);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_40);
  this->init_ = true;
  return (bool)(this->init_ & 1);
}

Assistant:

bool Regex::Init(const std::string& spec, std::string* error) {
  try {
    re_ = std::regex(spec, std::regex_constants::extended);

    init_ = true;
  } catch (const std::regex_error& e) {
    if (error) {
      *error = e.what();
    }
  }
  return init_;
}